

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  reference ppcVar5;
  reference pbVar6;
  pointer ppVar7;
  size_type sVar8;
  reference __rhs;
  string local_1508 [32];
  undefined1 local_14e8 [8];
  ostringstream cmCPackLog_msg_7;
  undefined1 local_1370 [8];
  cmGeneratedFileStream ofs_1;
  string local_1120 [7];
  bool res_1;
  undefined1 local_1100 [8];
  ostringstream cmCPackLog_msg_6;
  int local_f84;
  undefined1 local_f80 [4];
  int retVal_1;
  string output_1;
  undefined1 local_f40 [8];
  ostringstream cmCPackLog_msg_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  _Self local_d88;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>
  local_d80;
  iterator it_4;
  _Self local_d58;
  _Self local_d50;
  iterator bit;
  _Self local_d28;
  _Rb_tree_const_iterator<cmCPackIFWPackage_*> local_d20;
  iterator it_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf0;
  iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  string local_c68 [8];
  string ifwCmd_1;
  undefined1 local_c28 [8];
  ostringstream cmCPackLog_msg_4;
  string local_aa8 [32];
  undefined1 local_a88 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_910 [8];
  cmGeneratedFileStream ofs;
  string local_6c0 [7];
  bool res;
  undefined1 local_6a0 [8];
  ostringstream cmCPackLog_msg_2;
  int local_524;
  undefined1 local_520 [4];
  int retVal;
  string output;
  undefined1 local_4e0 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  _Self local_308;
  _Rb_tree_const_iterator<cmCPackIFWPackage_*> local_300;
  iterator it_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [8];
  string ifwCmd;
  string ifwTmpFile;
  string local_200;
  string local_1e0 [8];
  string ifwTLD;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackIFWGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"- Configuration");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0x45,pcVar4);
  std::__cxx11::string::~string((string *)(ifwTLD.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"CPACK_TOPLEVEL_DIRECTORY",
             (allocator *)(ifwTmpFile.field_2._M_local_buf + 0xf));
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,pcVar4,(allocator *)(ifwTmpFile.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(ifwTmpFile.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)(ifwTmpFile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(ifwCmd.field_2._M_local_buf + 8),local_1e0);
  std::__cxx11::string::operator+=((string *)(ifwCmd.field_2._M_local_buf + 8),"/IFWOutput.log");
  bVar2 = std::
          vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
          ::empty(&(this->Installer).Repositories);
  if (!bVar2) {
    std::__cxx11::string::string(local_248,(string *)&this->RepoGen);
    bVar2 = IsVersionLess(this,"2.0.0");
    if (bVar2) {
      std::operator+(&local_288," -c ",&(this->super_cmCPackGenerator).toplevel);
      std::operator+(&local_268,&local_288,"/config/config.xml");
      std::__cxx11::string::operator+=(local_248,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it," -p ",
                   &(this->super_cmCPackGenerator).toplevel);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "/packages");
    std::__cxx11::string::operator+=(local_248,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&it);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->PkgsDirsVector);
    if (!bVar2) {
      local_2d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->PkgsDirsVector);
      while( true ) {
        local_2d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->PkgsDirsVector);
        bVar2 = __gnu_cxx::operator!=(&local_2d0,&local_2d8);
        if (!bVar2) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                       " -p ",pbVar6);
        std::__cxx11::string::operator+=(local_248,(string *)&it_1);
        std::__cxx11::string::~string((string *)&it_1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2d0);
      }
    }
    if (((this->OnlineOnly & 1U) == 0) &&
       (bVar2 = std::
                set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
                ::empty(&this->DownloadedPackages), !bVar2)) {
      std::__cxx11::string::operator+=(local_248," -i ");
      local_300._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
           ::begin(&this->DownloadedPackages);
      ppcVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_300);
      std::__cxx11::string::operator+=(local_248,(string *)&(*ppcVar5)->Name);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_300);
      while( true ) {
        local_308._M_node =
             (_Base_ptr)
             std::
             set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
             ::end(&this->DownloadedPackages);
        bVar2 = std::operator!=(&local_300,&local_308);
        if (!bVar2) break;
        ppcVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_300);
        std::operator+(&local_328,",",&(*ppcVar5)->Name);
        std::__cxx11::string::operator+=(local_248,(string *)&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_300);
      }
    }
    std::operator+(&local_368," ",&(this->super_cmCPackGenerator).toplevel);
    std::operator+(&local_348,&local_368,"/repository");
    std::__cxx11::string::operator+=(local_248,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    poVar3 = std::operator<<((ostream *)local_4e0,"Execute: ");
    poVar3 = std::operator<<(poVar3,local_248);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x75,pcVar4);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    std::__cxx11::string::string((string *)local_520);
    local_524 = 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a0);
    poVar3 = std::operator<<((ostream *)local_6a0,"- Generate repository");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x79,pcVar4);
    std::__cxx11::string::~string(local_6c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ofs._583_1_ = cmSystemTools::RunSingleCommand
                            (pcVar4,(string *)local_520,(string *)local_520,&local_524,(char *)0x0,
                             (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
    if (((bool)ofs._583_1_) && (local_524 == 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
      poVar3 = std::operator<<((ostream *)local_c28,"- repository: ");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_cmCPackGenerator).toplevel);
      poVar3 = std::operator<<(poVar3,"/repository generated");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x8a,pcVar4);
      std::__cxx11::string::~string((string *)(ifwCmd_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
      bVar2 = false;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_910,pcVar4,false);
      poVar3 = std::operator<<((ostream *)local_910,"# Run command: ");
      poVar3 = std::operator<<(poVar3,local_248);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"# Output:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,(string *)local_520);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a88);
      poVar3 = std::operator<<((ostream *)local_a88,"Problem running IFW command: ");
      poVar3 = std::operator<<(poVar3,local_248);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"Please check ");
      poVar3 = std::operator<<(poVar3,(string *)(ifwCmd.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3," for errors");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x86,pcVar4);
      std::__cxx11::string::~string(local_aa8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a88);
      this_local._4_4_ = 0;
      bVar2 = true;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_910);
    }
    std::__cxx11::string::~string((string *)local_520);
    std::__cxx11::string::~string(local_248);
    if (bVar2) goto LAB_00495e4c;
  }
  std::__cxx11::string::string(local_c68,(string *)&this->BinCreator);
  std::operator+(&local_ca8," -c ",&(this->super_cmCPackGenerator).toplevel);
  std::operator+(&local_c88,&local_ca8,"/config/config.xml");
  std::__cxx11::string::operator+=(local_c68,(string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2," -p ",
                 &(this->super_cmCPackGenerator).toplevel);
  std::operator+(&local_cc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                 "/packages");
  std::__cxx11::string::operator+=(local_c68,(string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&it_2);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->PkgsDirsVector);
  if (!bVar2) {
    local_cf0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->PkgsDirsVector);
    while( true ) {
      local_cf8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->PkgsDirsVector);
      bVar2 = __gnu_cxx::operator!=(&local_cf0,&local_cf8);
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_cf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3,
                     " -p ",pbVar6);
      std::__cxx11::string::operator+=(local_c68,(string *)&it_3);
      std::__cxx11::string::~string((string *)&it_3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_cf0);
    }
  }
  if ((this->OnlineOnly & 1U) == 0) {
    bVar2 = std::
            set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
            ::empty(&this->DownloadedPackages);
    if ((bVar2) ||
       (bVar2 = std::
                vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
                ::empty(&(this->Installer).Repositories), bVar2)) {
      bVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
              ::empty(&this->DependentPackages);
      if (!bVar2) {
        std::__cxx11::string::operator+=(local_c68," -i ");
        local_d50._M_node =
             (_Base_ptr)
             std::
             set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
             ::begin(&this->BinaryPackages);
        while( true ) {
          local_d58._M_node =
               (_Base_ptr)
               std::
               set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
               ::end(&this->BinaryPackages);
          bVar2 = std::operator!=(&local_d50,&local_d58);
          if (!bVar2) break;
          ppcVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_d50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_4,
                         &(*ppcVar5)->Name,",");
          std::__cxx11::string::operator+=(local_c68,(string *)&it_4);
          std::__cxx11::string::~string((string *)&it_4);
          std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_d50);
        }
        local_d80._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
             ::begin(&this->DependentPackages);
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>
                 ::operator->(&local_d80);
        std::__cxx11::string::operator+=(local_c68,(string *)&ppVar7->second);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>
        ::operator++(&local_d80);
        while( true ) {
          local_d88._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
               ::end(&this->DependentPackages);
          bVar2 = std::operator!=(&local_d80,&local_d88);
          if (!bVar2) break;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>
                   ::operator->(&local_d80);
          std::operator+(&local_da8,",",&(ppVar7->second).Name);
          std::__cxx11::string::operator+=(local_c68,(string *)&local_da8);
          std::__cxx11::string::~string((string *)&local_da8);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>
          ::operator++(&local_d80);
        }
      }
    }
    else {
      std::__cxx11::string::operator+=(local_c68," -e ");
      local_d20._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
           ::begin(&this->DownloadedPackages);
      ppcVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_d20);
      std::__cxx11::string::operator+=(local_c68,(string *)&(*ppcVar5)->Name);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_d20);
      while( true ) {
        local_d28._M_node =
             (_Base_ptr)
             std::
             set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
             ::end(&this->DownloadedPackages);
        bVar2 = std::operator!=(&local_d20,&local_d28);
        if (!bVar2) break;
        ppcVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_d20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bit,","
                       ,&(*ppcVar5)->Name);
        std::__cxx11::string::operator+=(local_c68,(string *)&bit);
        std::__cxx11::string::~string((string *)&bit);
        std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_d20);
      }
    }
  }
  else {
    std::__cxx11::string::operator+=(local_c68," --online-only");
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_cmCPackGenerator).packageFileNames);
  if (sVar8 == 0) {
    std::__cxx11::string::operator+=(local_c68," installer");
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::operator+(&local_dc8," ",__rhs);
    std::__cxx11::string::operator+=(local_c68,(string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f40);
  poVar3 = std::operator<<((ostream *)local_f40,"Execute: ");
  poVar3 = std::operator<<(poVar3,local_c68);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xcb,pcVar4);
  std::__cxx11::string::~string((string *)(output_1.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f40);
  std::__cxx11::string::string((string *)local_f80);
  local_f84 = 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1100);
  poVar3 = std::operator<<((ostream *)local_1100,"- Generate package");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xce,pcVar4);
  std::__cxx11::string::~string(local_1120);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1100);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  ofs_1._583_1_ =
       cmSystemTools::RunSingleCommand
                 (pcVar4,(string *)local_f80,(string *)local_f80,&local_f84,(char *)0x0,
                  (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  if (((bool)ofs_1._583_1_) && (local_f84 == 0)) {
    bVar2 = false;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1370,pcVar4,false);
    poVar3 = std::operator<<((ostream *)local_1370,"# Run command: ");
    poVar3 = std::operator<<(poVar3,local_c68);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# Output:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,(string *)local_f80);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14e8);
    poVar3 = std::operator<<((ostream *)local_14e8,"Problem running IFW command: ");
    poVar3 = std::operator<<(poVar3,local_c68);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Please check ");
    poVar3 = std::operator<<(poVar3,(string *)(ifwCmd.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," for errors");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0xdb,pcVar4);
    std::__cxx11::string::~string(local_1508);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14e8);
    this_local._4_4_ = 0;
    bVar2 = true;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1370);
  }
  std::__cxx11::string::~string((string *)local_f80);
  std::__cxx11::string::~string(local_c68);
  if (!bVar2) {
    this_local._4_4_ = 1;
  }
LAB_00495e4c:
  std::__cxx11::string::~string((string *)(ifwCmd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  Installer.GenerateInstallerFile();

  // Packages configuration
  Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = ifwTLD;
  ifwTmpFile += "/IFWOutput.log";

  // Run repogen
  if (!Installer.Repositories.empty())
    {
    std::string ifwCmd = RepoGen;

    if(IsVersionLess("2.0.0"))
      {
      ifwCmd += " -c " + this->toplevel + "/config/config.xml";
      }

    ifwCmd += " -p " + this->toplevel + "/packages";

    if(!PkgsDirsVector.empty())
      {
      for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
          it != PkgsDirsVector.end(); ++it)
        {
        ifwCmd += " -p " + *it;
        }
      }

    if (!OnlineOnly && !DownloadedPackages.empty())
      {
      ifwCmd += " -i ";
      std::set<cmCPackIFWPackage*>::iterator it
        = DownloadedPackages.begin();
      ifwCmd += (*it)->Name;
      ++it;
      while(it != DownloadedPackages.end())
        {
        ifwCmd += "," + (*it)->Name;
        ++it;
        }
      }
    ifwCmd += " " + this->toplevel + "/repository";
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                  << std::endl);
    std::string output;
    int retVal = 1;
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Generate repository" << std::endl);
    bool res = cmSystemTools::RunSingleCommand(
      ifwCmd.c_str(), &output, &output,
      &retVal, 0, this->GeneratorVerbose, 0);
    if ( !res || retVal )
      {
      cmGeneratedFileStream ofs(ifwTmpFile.c_str());
      ofs << "# Run command: " << ifwCmd << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                    << ifwCmd << std::endl
                    << "Please check " << ifwTmpFile << " for errors"
                    << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- repository: " << this->toplevel
                  << "/repository generated" << std::endl);
    }

  // Run binary creator
  {
  std::string ifwCmd = BinCreator;
  ifwCmd += " -c " + this->toplevel + "/config/config.xml";
  ifwCmd += " -p " + this->toplevel + "/packages";

  if(!PkgsDirsVector.empty())
    {
    for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
        it != PkgsDirsVector.end(); ++it)
      {
      ifwCmd += " -p " + *it;
      }
    }

  if (OnlineOnly)
    {
    ifwCmd += " --online-only";
    }
  else if (!DownloadedPackages.empty() && !Installer.Repositories.empty())
    {
    ifwCmd += " -e ";
    std::set<cmCPackIFWPackage*>::iterator it
      = DownloadedPackages.begin();
    ifwCmd += (*it)->Name;
    ++it;
    while(it != DownloadedPackages.end())
      {
      ifwCmd += "," + (*it)->Name;
      ++it;
      }
    }
  else if (!DependentPackages.empty())
    {
    ifwCmd += " -i ";
    // Binary
    std::set<cmCPackIFWPackage*>::iterator bit = BinaryPackages.begin();
    while(bit != BinaryPackages.end())
      {
      ifwCmd += (*bit)->Name + ",";
      ++bit;
      }
    // Depend
    DependenceMap::iterator it = DependentPackages.begin();
    ifwCmd += it->second.Name;
    ++it;
    while(it != DependentPackages.end())
      {
      ifwCmd += "," + it->second.Name;
      ++it;
      }
    }
  // TODO: set correct name for multipackages
  if (this->packageFileNames.size() > 0)
    {
    ifwCmd += " " + packageFileNames[0];
    }
  else
    {
    ifwCmd += " installer";
    }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(
    ifwCmd.c_str(), &output, &output,
    &retVal, 0, this->GeneratorVerbose, 0);
  if ( !res || retVal )
    {
    cmGeneratedFileStream ofs(ifwTmpFile.c_str());
    ofs << "# Run command: " << ifwCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                  << ifwCmd << std::endl
                  << "Please check " << ifwTmpFile << " for errors"
                  << std::endl);
    return 0;
    }
  }

  return 1;
}